

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBadTypeAttributes.cpp
# Opt level: O0

void anon_unknown.dwarf_3b1cf::testTiledWithBadAttribute(char *file)

{
  int iVar1;
  char *in_RDI;
  char *unaff_retaddr;
  InputPart ip;
  MultiPartInputFile multiin_1;
  InputFile sin;
  bool in_stack_0000005f;
  TiledInputPart *in_stack_00000060;
  TiledInputPart tip;
  MultiPartInputFile multiin;
  TiledInputFile in;
  InputPart local_68 [8];
  MultiPartInputFile local_60 [16];
  InputFile local_50 [16];
  TiledInputPart local_40 [8];
  MultiPartInputFile local_38 [32];
  TiledInputFile local_18 [7];
  undefined1 in_stack_ffffffffffffffef;
  InputPart *in_stack_fffffffffffffff0;
  
  iVar1 = Imf_3_2::globalThreadCount();
  Imf_3_2::TiledInputFile::TiledInputFile(local_18,in_RDI,iVar1);
  readTiledThing<Imf_3_2::TiledInputFile>((TiledInputFile *)in_stack_00000060,in_stack_0000005f);
  iVar1 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartInputFile::MultiPartInputFile(local_38,in_RDI,iVar1,true);
  Imf_3_2::TiledInputPart::TiledInputPart(local_40,local_38,0);
  readTiledThing<Imf_3_2::TiledInputPart>(in_stack_00000060,in_stack_0000005f);
  iVar1 = Imf_3_2::globalThreadCount();
  Imf_3_2::InputFile::InputFile(local_50,in_RDI,iVar1);
  readScanlineThing<Imf_3_2::InputFile>
            ((InputFile *)in_stack_fffffffffffffff0,(bool)in_stack_ffffffffffffffef);
  Imf_3_2::InputFile::~InputFile(local_50);
  Imf_3_2::MultiPartInputFile::~MultiPartInputFile(local_38);
  iVar1 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartInputFile::MultiPartInputFile(local_60,in_RDI,iVar1,true);
  Imf_3_2::InputPart::InputPart(local_68,local_60,0);
  readScanlineThing<Imf_3_2::InputPart>(in_stack_fffffffffffffff0,(bool)in_stack_ffffffffffffffef);
  Imf_3_2::MultiPartInputFile::~MultiPartInputFile(local_60);
  checkDeepTypesFailToLoad(unaff_retaddr);
  Imf_3_2::TiledInputFile::~TiledInputFile(local_18);
  return;
}

Assistant:

void
testTiledWithBadAttribute (const char* file)
{
    // it's a tiled file, so it should read as a file
    TiledInputFile in (file);
    readTiledThing (in, false);

    {
        // it should also read using the multipart API (and have its attribute fixed)
        MultiPartInputFile multiin (file);
        TiledInputPart     tip (multiin, 0);
        readTiledThing (tip, true);

        // it should also read using the regular file API as a scanline file
        InputFile sin (file);
        readScanlineThing (sin, false);
    }
    {
        // it should also read using the multipart API as a scanline file
        MultiPartInputFile multiin (file);

        InputPart ip (multiin, 0);
        readScanlineThing (ip, false);
    }

    checkDeepTypesFailToLoad (file);
}